

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O1

void spvtools::opt::ReplacePhiParentWith(Instruction *inst,uint32_t orig_block,uint32_t new_block)

{
  pointer pOVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 local_40 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_20;
  
  uVar2 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar2 = (uint)inst->has_result_id_;
  }
  uVar3 = Instruction::GetSingleWordOperand(inst,uVar2 + 1);
  if (uVar3 == orig_block) {
    uVar4 = (ulong)(inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar4 = (ulong)inst->has_result_id_;
    }
    uVar4 = uVar4 + 1;
  }
  else {
    uVar4 = (ulong)(inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar4 = (ulong)inst->has_result_id_;
    }
    uVar4 = uVar4 + 3;
  }
  local_40._24_8_ = local_40 + 0x10;
  local_20._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_40._8_8_ = 1;
  local_40._0_8_ = &PTR__SmallVector_003e9b28;
  pOVar1 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 4) *
          -0x5555555555555555;
  local_40._16_4_ = new_block;
  if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)
               ((long)((pOVar1->words).buffer + 0xfffffffffffffffc) +
               (ulong)(uint)((int)uVar4 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_40);
    local_40._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_20._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_20,local_20._M_head_impl);
    }
    return;
  }
  __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                ,0x2b8,
                "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)");
}

Assistant:

void ReplacePhiParentWith(Instruction* inst, uint32_t orig_block,
                          uint32_t new_block) {
  if (inst->GetSingleWordInOperand(1) == orig_block) {
    inst->SetInOperand(1, {new_block});
  } else {
    inst->SetInOperand(3, {new_block});
  }
}